

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoration_manager.cpp
# Opt level: O0

vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> * __thiscall
spvtools::opt::analysis::DecorationManager::InternalGetDecorationsFor<spvtools::opt::Instruction*>
          (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           *__return_storage_ptr__,DecorationManager *this,uint32_t id,bool include_linkage)

{
  bool bVar1;
  pointer ppVar2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *this_00;
  reference ppIVar3;
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
  local_88;
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
  local_80;
  iterator group_iter;
  uint32_t group_id;
  Instruction *inst;
  const_iterator __end3;
  const_iterator __begin3;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range3;
  anon_class_16_2_454f39be process_direct_decorations;
  TargetData *target_data;
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
  local_30;
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
  local_28;
  iterator ids_iter;
  bool include_linkage_local;
  uint32_t id_local;
  DecorationManager *this_local;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *decorations;
  
  ids_iter.
  super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
  ._M_cur._2_1_ = 0;
  ids_iter.
  super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
  ._M_cur._3_1_ = include_linkage;
  ids_iter.
  super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
  ._M_cur._4_4_ = id;
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
            (__return_storage_ptr__);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>_>
       ::find(&this->id_to_decoration_insts_,
              (key_type *)
              ((long)&ids_iter.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                      ._M_cur + 4));
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>_>
       ::end(&this->id_to_decoration_insts_);
  bVar1 = std::__detail::operator==(&local_28,&local_30);
  if (!bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false,_false>
                           *)&local_28);
    process_direct_decorations.decorations = &(ppVar2->second).direct_decorations;
    __range3._0_1_ =
         ids_iter.
         super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
         ._M_cur._3_1_ & 1;
    process_direct_decorations._0_8_ = __return_storage_ptr__;
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false,_false>
                           *)&local_28);
    InternalGetDecorationsFor<spvtools::opt::Instruction_*>::anon_class_16_2_454f39be::operator()
              ((anon_class_16_2_454f39be *)&__range3,&(ppVar2->second).direct_decorations);
    this_00 = process_direct_decorations.decorations + 1;
    __end3 = std::
             vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
             begin(this_00);
    inst = (Instruction *)
           std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           ::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<spvtools::opt::Instruction_*const_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                                       *)&inst), bVar1) {
      ppIVar3 = __gnu_cxx::
                __normal_iterator<spvtools::opt::Instruction_*const_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                ::operator*(&__end3);
      group_iter.
      super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
      ._M_cur._4_4_ = opt::Instruction::GetSingleWordInOperand(*ppIVar3,0);
      local_80._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>_>
           ::find(&this->id_to_decoration_insts_,
                  (key_type *)
                  ((long)&group_iter.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                          ._M_cur + 4));
      local_88._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>_>
           ::end(&this->id_to_decoration_insts_);
      bVar1 = std::__detail::operator!=(&local_80,&local_88);
      if (!bVar1) {
        __assert_fail("group_iter != id_to_decoration_insts_.end() && \"Unknown group ID\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/decoration_manager.cpp"
                      ,0x1c7,
                      "std::vector<T> spvtools::opt::analysis::DecorationManager::InternalGetDecorationsFor(uint32_t, bool) [T = spvtools::opt::Instruction *]"
                     );
      }
      ppVar2 = std::__detail::
               _Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false,_false>
                             *)&local_80);
      InternalGetDecorationsFor<spvtools::opt::Instruction_*>::anon_class_16_2_454f39be::operator()
                ((anon_class_16_2_454f39be *)&__range3,&(ppVar2->second).direct_decorations);
      __gnu_cxx::
      __normal_iterator<spvtools::opt::Instruction_*const_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
      ::operator++(&__end3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> DecorationManager::InternalGetDecorationsFor(
    uint32_t id, bool include_linkage) {
  std::vector<T> decorations;

  const auto ids_iter = id_to_decoration_insts_.find(id);
  // |id| has no decorations
  if (ids_iter == id_to_decoration_insts_.end()) return decorations;

  const TargetData& target_data = ids_iter->second;

  const auto process_direct_decorations =
      [include_linkage,
       &decorations](const std::vector<Instruction*>& direct_decorations) {
        for (Instruction* inst : direct_decorations) {
          const bool is_linkage =
              inst->opcode() == spv::Op::OpDecorate &&
              spv::Decoration(inst->GetSingleWordInOperand(1u)) ==
                  spv::Decoration::LinkageAttributes;
          if (include_linkage || !is_linkage) decorations.push_back(inst);
        }
      };

  // Process |id|'s decorations.
  process_direct_decorations(ids_iter->second.direct_decorations);

  // Process the decorations of all groups applied to |id|.
  for (const Instruction* inst : target_data.indirect_decorations) {
    const uint32_t group_id = inst->GetSingleWordInOperand(0u);
    const auto group_iter = id_to_decoration_insts_.find(group_id);
    assert(group_iter != id_to_decoration_insts_.end() && "Unknown group ID");
    process_direct_decorations(group_iter->second.direct_decorations);
  }

  return decorations;
}